

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void sse::Flip(Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height,
              uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *inYEnd,bool horizontal,
              bool vertical,uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  undefined1 auVar3 [16];
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  long lVar7;
  uchar *puVar8;
  undefined1 (*pauVar9) [16];
  
  auVar3 = _DAT_00123310;
  if (horizontal && !vertical) {
    if (inY != inYEnd) {
      puVar4 = out->_data +
               ((ulong)width - 0x10) + (ulong)(startYOut * rowSizeOut) + (ulong)startXOut;
      puVar5 = out->_data +
               (ulong)(startYOut * rowSizeOut) +
               ~(ulong)totalSimdWidth + (ulong)width + (ulong)startXOut;
      do {
        if (simdWidth != 0) {
          lVar7 = 0;
          pauVar9 = (undefined1 (*) [16])inY;
          do {
            auVar1 = *pauVar9;
            pauVar9 = pauVar9 + 1;
            auVar1 = vpshufb_avx(auVar1,auVar3);
            *(undefined1 (*) [16])(puVar4 + lVar7) = auVar1;
            lVar7 = lVar7 + -0x10;
          } while (-lVar7 != (ulong)simdWidth * 0x10);
        }
        if (nonSimdWidth != 0) {
          puVar8 = *(undefined1 (*) [16])inY + totalSimdWidth;
          lVar7 = 0;
          do {
            uVar2 = *puVar8;
            puVar8 = puVar8 + 1;
            puVar5[lVar7] = uVar2;
            lVar7 = lVar7 + -1;
          } while (-lVar7 != (ulong)nonSimdWidth);
        }
        inY = *(undefined1 (*) [16])inY + rowSizeIn;
        puVar4 = puVar4 + rowSizeOut;
        puVar5 = puVar5 + rowSizeOut;
      } while (inY != inYEnd);
    }
  }
  else if (vertical && !horizontal) {
    if (inY != inYEnd) {
      puVar4 = out->_data + (ulong)startXOut + (ulong)(((startYOut - 1) + height) * rowSizeOut);
      do {
        memcpy(puVar4,inY,(ulong)width);
        inY = inY + rowSizeIn;
        puVar4 = puVar4 + -(ulong)rowSizeOut;
      } while (inY != inYEnd);
    }
  }
  else if (inY != inYEnd) {
    uVar6 = (ulong)(((startYOut - 1) + height) * rowSizeOut);
    puVar4 = out->_data + ((ulong)width - 0x10) + uVar6 + startXOut;
    puVar5 = out->_data + uVar6 + ~(ulong)totalSimdWidth + (ulong)width + (ulong)startXOut;
    do {
      if (simdWidth != 0) {
        lVar7 = 0;
        pauVar9 = (undefined1 (*) [16])inY;
        do {
          auVar1 = *pauVar9;
          pauVar9 = pauVar9 + 1;
          auVar1 = vpshufb_avx(auVar1,auVar3);
          *(undefined1 (*) [16])(puVar4 + lVar7) = auVar1;
          lVar7 = lVar7 + -0x10;
        } while (-lVar7 != (ulong)simdWidth * 0x10);
      }
      if (nonSimdWidth != 0) {
        puVar8 = *(undefined1 (*) [16])inY + totalSimdWidth;
        lVar7 = 0;
        do {
          uVar2 = *puVar8;
          puVar8 = puVar8 + 1;
          puVar5[lVar7] = uVar2;
          lVar7 = lVar7 + -1;
        } while (-lVar7 != (ulong)nonSimdWidth);
      }
      inY = *(undefined1 (*) [16])inY + rowSizeIn;
      puVar4 = puVar4 + -(ulong)rowSizeOut;
      puVar5 = puVar5 + -(ulong)rowSizeOut;
    } while (inY != inYEnd);
  }
  return;
}

Assistant:

void Flip( Image_Function::Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, const uint32_t rowSizeIn, 
               const uint32_t rowSizeOut, const uint8_t * inY, const uint8_t * inYEnd, bool horizontal, bool vertical, const uint32_t simdWidth, 
               const uint32_t totalSimdWidth, const uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm_setr_epi8( 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0 );

        if( horizontal && !vertical ) {
            uint8_t * outYSimd = out.data() + startYOut * rowSizeOut + startXOut + width - simdSize;
            uint8_t * outY = out.data() + startYOut * rowSizeOut + startXOut + width - 1;

            for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut, outYSimd += rowSizeOut ) {
                const simd * inXSimd    = reinterpret_cast<const simd*>(inY);
                simd       * outXSimd   = reinterpret_cast<simd*>(outYSimd);
                const simd * inXEndSimd = inXSimd + simdWidth;

                for( ; inXSimd != inXEndSimd; ++inXSimd, --outXSimd )
                    _mm_storeu_si128( outXSimd, _mm_shuffle_epi8( _mm_loadu_si128( inXSimd ), ctrl ) );
                        
                if(nonSimdWidth > 0)
                {
                    const uint8_t * inX    = inY + totalSimdWidth;
                    uint8_t       * outX   = outY - totalSimdWidth;
                    const uint8_t * inXEnd = inX + nonSimdWidth;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
        else if( !horizontal && vertical ) {
            uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut;

            for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut )
                memcpy( outY, inY, sizeof( uint8_t ) * width );
        }
        else {
            uint8_t * outYSimd = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - simdSize;
            uint8_t * outY = out.data() + (startYOut + height - 1) * rowSizeOut + startXOut + width - 1;

            for( ; inY != inYEnd; inY += rowSizeIn, outY -= rowSizeOut, outYSimd -= rowSizeOut ) {
                const simd * inXSimd    = reinterpret_cast<const simd*>(inY);
                simd       * outXSimd   = reinterpret_cast<simd*>(outYSimd);
                const simd * inXEndSimd = inXSimd + simdWidth;

                for( ; inXSimd != inXEndSimd; ++inXSimd, --outXSimd )
                    _mm_storeu_si128( outXSimd, _mm_shuffle_epi8( _mm_loadu_si128( inXSimd ), ctrl ) );
                        
                if(nonSimdWidth > 0)
                {
                    const uint8_t * inX    = inY + totalSimdWidth;
                    uint8_t       * outX   = outY - totalSimdWidth;
                    const uint8_t * inXEnd = inX + nonSimdWidth;

                    for( ; inX != inXEnd; ++inX, --outX )
                        (*outX) = (*inX);
                }
            }
        }
    }